

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cc
# Opt level: O1

Slice * raptor::MakeSliceByLength(Slice *__return_storage_ptr__,size_t len)

{
  SliceRefCount *pSVar1;
  
  (__return_storage_ptr__->_data).refcounted.bytes = (uint8_t *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->_data + 0x10) = 0;
  __return_storage_ptr__->_refs = (SliceRefCount *)0x0;
  (__return_storage_ptr__->_data).refcounted.length = 0;
  if (len < 0x18) {
    __return_storage_ptr__->_refs = (SliceRefCount *)0x0;
    (__return_storage_ptr__->_data).inlined.length = (uint8_t)len;
  }
  else {
    pSVar1 = (SliceRefCount *)Malloc(len + 4);
    __return_storage_ptr__->_refs = pSVar1;
    (pSVar1->_refs)._value.super___atomic_base<int>._M_i = 0;
    (pSVar1->_refs)._value.super___atomic_base<int>._M_i = 1;
    (__return_storage_ptr__->_data).refcounted.length = len;
    (__return_storage_ptr__->_data).refcounted.bytes =
         (uint8_t *)(__return_storage_ptr__->_refs + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Slice MakeSliceByLength(size_t len) {
    Slice s;
    if (len <= Slice::SLICE_INLINED_SIZE) {
        s._refs = nullptr;
        s._data.inlined.length = static_cast<uint8_t>(len);
    } else {
        s._refs = (SliceRefCount*)Malloc(sizeof(SliceRefCount) + len);
        new (s._refs) SliceRefCount;
        s._data.refcounted.length = len;
        s._data.refcounted.bytes = reinterpret_cast<uint8_t*>(s._refs + 1);
    }
    return s;
}